

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD3Importer::ReadShader(MD3Importer *this,ShaderData *fill)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string model_file;
  
  psVar1 = &this->path;
  std::__cxx11::string::find_last_of((char *)psVar1,0x5fcb96);
  std::__cxx11::string::substr((ulong)&model_file,(ulong)psVar1);
  if ((this->configShaderFile)._M_string_length == 0) {
    std::operator+(&local_60,psVar1,"..\\..\\..\\scripts\\");
    std::operator+(&local_a0,&local_60,&model_file);
    std::operator+(&local_80,&local_a0,".shader");
    bVar2 = Q3Shader::LoadShader(fill,&local_80,this->mIOHandler);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar2) goto LAB_0042b83b;
    std::operator+(&local_60,psVar1,"..\\..\\..\\scripts\\");
    std::operator+(&local_a0,&local_60,&this->filename);
    std::operator+(&local_80,&local_a0,".shader");
    Q3Shader::LoadShader(fill,&local_80,this->mIOHandler);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    this_00 = &local_60;
  }
  else {
    psVar1 = &this->configShaderFile;
    lVar3 = std::__cxx11::string::rfind((char)psVar1,0x2e);
    if (lVar3 != -1) {
      Q3Shader::LoadShader(fill,psVar1,this->mIOHandler);
      goto LAB_0042b83b;
    }
    std::operator+(&local_a0,psVar1,&model_file);
    std::operator+(&local_80,&local_a0,".shader");
    bVar2 = Q3Shader::LoadShader(fill,&local_80,this->mIOHandler);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar2) goto LAB_0042b83b;
    std::operator+(&local_a0,psVar1,&this->filename);
    std::operator+(&local_80,&local_a0,".shader");
    Q3Shader::LoadShader(fill,&local_80,this->mIOHandler);
    std::__cxx11::string::~string((string *)&local_80);
    this_00 = &local_a0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0042b83b:
  std::__cxx11::string::~string((string *)&model_file);
  return;
}

Assistant:

void MD3Importer::ReadShader(Q3Shader::ShaderData& fill) const
{
    // Determine Q3 model name from given path
    const std::string::size_type s = path.find_last_of("\\/",path.length()-2);
    const std::string model_file = path.substr(s+1,path.length()-(s+2));

    // If no specific dir or file is given, use our default search behaviour
    if (!configShaderFile.length()) {
        if(!Q3Shader::LoadShader(fill,path + "..\\..\\..\\scripts\\" + model_file + ".shader",mIOHandler)) {
            Q3Shader::LoadShader(fill,path + "..\\..\\..\\scripts\\" + filename + ".shader",mIOHandler);
        }
    }
    else {
        // If the given string specifies a file, load this file.
        // Otherwise it's a directory.
        const std::string::size_type st = configShaderFile.find_last_of('.');
        if (st == std::string::npos) {

            if(!Q3Shader::LoadShader(fill,configShaderFile + model_file + ".shader",mIOHandler)) {
                Q3Shader::LoadShader(fill,configShaderFile + filename + ".shader",mIOHandler);
            }
        }
        else {
            Q3Shader::LoadShader(fill,configShaderFile,mIOHandler);
        }
    }
}